

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseCommon.cpp
# Opt level: O2

uint __thiscall
siamese::OriginalPacket::Initialize
          (OriginalPacket *this,Allocator *allocator,SiameseOriginalPacket *packet)

{
  byte *pbVar1;
  bool bVar2;
  byte bVar3;
  byte bVar5;
  uint uVar4;
  byte bVar6;
  
  bVar2 = GrowingAlignedDataBuffer::Initialize(&this->Buffer,allocator,packet->DataBytes + 4);
  uVar4 = 0;
  if (bVar2) {
    uVar4 = packet->DataBytes;
    pbVar1 = (this->Buffer).Data;
    bVar3 = (byte)uVar4;
    if (uVar4 < 0x80) {
      *pbVar1 = bVar3;
      uVar4 = 1;
    }
    else {
      bVar5 = (byte)(uVar4 >> 8);
      if (uVar4 < 0x4000) {
        *pbVar1 = bVar5 | 0x80;
        pbVar1[1] = bVar3;
        uVar4 = 2;
      }
      else {
        bVar6 = (byte)(uVar4 >> 0x10);
        if (uVar4 < 0x200000) {
          *pbVar1 = bVar6 | 0xc0;
          pbVar1[1] = bVar5;
          pbVar1[2] = bVar3;
          uVar4 = 3;
        }
        else {
          *pbVar1 = (byte)(uVar4 >> 0x18) | 0xe0;
          pbVar1[1] = bVar6;
          pbVar1[2] = bVar5;
          pbVar1[3] = bVar3;
          uVar4 = 4;
        }
      }
    }
    this->HeaderBytes = uVar4;
    memcpy((this->Buffer).Data + uVar4,packet->Data,(ulong)packet->DataBytes);
    uVar4 = this->HeaderBytes;
    (this->Buffer).Bytes = packet->DataBytes + uVar4;
    this->Column = packet->PacketNum;
  }
  return uVar4;
}

Assistant:

unsigned OriginalPacket::Initialize(pktalloc::Allocator* allocator, const SiameseOriginalPacket& packet)
{
    SIAMESE_DEBUG_ASSERT(allocator && packet.Data && packet.DataBytes > 0 && packet.PacketNum < kColumnPeriod);

    // Allocate space for the packet
    const unsigned bufferSize = kMaxPacketLengthFieldBytes + packet.DataBytes;
    if (!Buffer.Initialize(allocator, bufferSize))
        return 0;

    // Serialize the packet length into the front using a compressed format
    HeaderBytes = SerializeHeader_PacketLength(packet.DataBytes, Buffer.Data);
    SIAMESE_DEBUG_ASSERT(HeaderBytes <= kMaxPacketLengthFieldBytes);

    // Copy packet data after the length
    memcpy(Buffer.Data + HeaderBytes, packet.Data, packet.DataBytes);

    Buffer.Bytes = HeaderBytes + packet.DataBytes;

    Column = packet.PacketNum;

    return HeaderBytes;
}